

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int ARKodeSetJacTimesRhsFn(void *arkode_mem,ARKRhsFn jtimesRhsFn)

{
  ARKRhsFn p_Var1;
  ARKSetAdaptControllerFn in_RSI;
  ARKodeMem in_RDI;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x3c9,"ARKodeSetJacTimesRhsFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->step_supports_implicit == 0) {
    arkProcessError(in_RDI,-0x30,0x3d2,"ARKodeSetJacTimesRhsFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"time-stepping module does not require an algebraic solver");
    local_4 = -0x30;
  }
  else {
    local_4 = arkLs_AccessLMem(in_stack_ffffffffffffffd8,
                               (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                               ,in_stack_ffffffffffffffc8);
    if (local_4 == 0) {
      if (*(int *)&in_stack_ffffffffffffffd8->step_getnumrhsevals == 0) {
        arkProcessError(in_RDI,-3,0x3de,"ARKodeSetJacTimesRhsFn",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"Internal finite-difference Jacobian-vector product is disabled.");
        local_4 = -3;
      }
      else {
        if (in_RSI == (ARKSetAdaptControllerFn)0x0) {
          p_Var1 = (*in_RDI->step_getimplicitrhs)(in_RDI);
          in_stack_ffffffffffffffd8->step_setadaptcontroller = (ARKSetAdaptControllerFn)p_Var1;
          if (in_stack_ffffffffffffffd8->step_setadaptcontroller == (ARKSetAdaptControllerFn)0x0) {
            arkProcessError(in_RDI,-3,0x3eb,"ARKodeSetJacTimesRhsFn",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                            ,"Time step module is missing implicit RHS fcn");
            return -3;
          }
        }
        else {
          in_stack_ffffffffffffffd8->step_setadaptcontroller = in_RSI;
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetJacTimesRhsFn(void* arkode_mem, ARKRhsFn jtimesRhsFn)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check if using internal finite difference approximation */
  if (!(arkls_mem->jtimesDQ))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Internal finite-difference Jacobian-vector product is disabled.");
    return (ARKLS_ILL_INPUT);
  }

  /* store function pointers for RHS function (NULL implies use ODE RHS) */
  if (jtimesRhsFn != NULL) { arkls_mem->Jt_f = jtimesRhsFn; }
  else
  {
    arkls_mem->Jt_f = ark_mem->step_getimplicitrhs(ark_mem);

    if (arkls_mem->Jt_f == NULL)
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Time step module is missing implicit RHS fcn");
      return (ARKLS_ILL_INPUT);
    }
  }

  return (ARKLS_SUCCESS);
}